

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QSharedDataPointer<QStyleSheetPaletteData>::reset
          (QSharedDataPointer<QStyleSheetPaletteData> *this,QStyleSheetPaletteData *ptr)

{
  bool bVar1;
  QStyleSheetPaletteData *pQVar2;
  QStyleSheetPaletteData *in_RSI;
  QStyleSheetPaletteData *in_RDI;
  long in_FS_OFFSET;
  QStyleSheetPaletteData *old;
  totally_ordered_wrapper<QStyleSheetPaletteData_*> *in_stack_ffffffffffffffb8;
  totally_ordered_wrapper<QStyleSheetPaletteData_*> local_18;
  totally_ordered_wrapper<QStyleSheetPaletteData_*> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = Qt::totally_ordered_wrapper<QStyleSheetPaletteData_*>::get
                     ((totally_ordered_wrapper<QStyleSheetPaletteData_*> *)in_RDI);
  if (in_RSI != pQVar2) {
    if (in_RSI != (QStyleSheetPaletteData *)0x0) {
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x45367c);
    }
    Qt::totally_ordered_wrapper<QStyleSheetPaletteData_*>::totally_ordered_wrapper(&local_18,in_RSI)
    ;
    local_10 = std::
               exchange<Qt::totally_ordered_wrapper<QStyleSheetPaletteData*>,Qt::totally_ordered_wrapper<QStyleSheetPaletteData*>>
                         (in_stack_ffffffffffffffb8,
                          (totally_ordered_wrapper<QStyleSheetPaletteData_*> *)0x45369a);
    pQVar2 = Qt::totally_ordered_wrapper<QStyleSheetPaletteData_*>::get(&local_10);
    if (((pQVar2 != (QStyleSheetPaletteData *)0x0) &&
        (bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x4536c0), !bVar1)) &&
       (pQVar2 != (QStyleSheetPaletteData *)0x0)) {
      QStyleSheetPaletteData::~QStyleSheetPaletteData(in_RDI);
      operator_delete(pQVar2,0x38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void reset(T *ptr = nullptr) noexcept
    {
        if (ptr != d.get()) {
            if (ptr)
                ptr->ref.ref();
            T *old = std::exchange(d, Qt::totally_ordered_wrapper(ptr)).get();
            if (old && !old->ref.deref())
                delete old;
        }
    }